

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RBTree.h
# Opt level: O0

RBTree<int> * BinTrees::RBTree<int>::gen(initializer_list<int> l,int *sum)

{
  int iVar1;
  const_iterator piVar2;
  initializer_list<int> *v;
  initializer_list<int> *piVar3;
  RBTree<int> *pRVar4;
  int *piVar5;
  int *in_RDX;
  int *in_stack_00000018;
  RBTree<int> *in_stack_00000020;
  const_iterator i;
  BinSTree<int> *p;
  RBTree<int> *t;
  BinTree<int> *in_stack_ffffffffffffffa0;
  initializer_list<int> *this;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  RBTree<int> *local_20;
  initializer_list<int> local_10;
  
  *in_RDX = 0;
  local_20 = (RBTree<int> *)operator_new(0x28);
  pRVar4 = local_20;
  std::initializer_list<int>::begin(&local_10);
  RBTree<int_const&>(pRVar4,(int *)local_20,in_stack_ffffffffffffffa0);
  pRVar4 = local_20;
  piVar2 = std::initializer_list<int>::begin(&local_10);
  *in_RDX = *piVar2 + *in_RDX;
  v = (initializer_list<int> *)std::initializer_list<int>::begin(&local_10);
  while( true ) {
    this = (initializer_list<int> *)((long)&v->_M_array + 4);
    v = this;
    piVar3 = (initializer_list<int> *)std::initializer_list<int>::end(this);
    if (piVar3 <= this) break;
    local_20 = i<int_const&>(in_stack_00000020,in_stack_00000018);
    pRVar4 = (RBTree<int> *)BinSTree<int>::search(&pRVar4->super_BinSTree<int>,(int *)v);
    in_stack_ffffffffffffffbc =
         BinSTree<int>::suc((BinSTree<int> *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    piVar5 = BinTree<int>::V((BinTree<int> *)pRVar4);
    in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc - *piVar5;
    piVar5 = BinTree<int>::V((BinTree<int> *)pRVar4);
    iVar1 = *piVar5;
    in_stack_ffffffffffffffb8 =
         BinSTree<int>::pre((BinSTree<int> *)
                            CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    in_stack_ffffffffffffffb8 = iVar1 - in_stack_ffffffffffffffb8;
    piVar5 = std::min<int>((int *)&stack0xffffffffffffffbc,(int *)&stack0xffffffffffffffb8);
    *in_RDX = *piVar5 + *in_RDX;
  }
  return local_20;
}

Assistant:

RBTree<T> *RBTree<T>::gen(std::initializer_list<T> l, T &sum) {
        sum = 0;
        auto t = new RBTree<T>(*(l.begin()));
        const BinTrees::BinSTree<int> *p = t;
        sum += *(l.begin());
        auto i = l.begin() + 1;
        for (i; i < l.end(); i++) {
            t = t->i(*i);
            p = &(t->search(*i));
            sum += std::min(p->suc() - p->V(), p->V() - p->pre());
        }
        return t;
    }